

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.h
# Opt level: O0

void __thiscall
HighsMipSolverData::HighsMipSolverData(HighsMipSolverData *this,HighsMipSolver *mipsolver)

{
  HighsMipSolver *in_RSI;
  HighsMipSolver *in_RDI;
  HighsDomain *unaff_retaddr;
  HighsMipSolver *in_stack_00000028;
  HighsLpRelaxation *in_stack_00000030;
  HighsMipSolver *in_stack_fffffffffffffed8;
  HighsPseudocost *in_stack_fffffffffffffee0;
  HighsCutPool *cutpool;
  HighsDomain *this_00;
  HighsNodeQueue *this_01;
  HighsSymmetries *this_02;
  HighsMipSolver *in_stack_ffffffffffffff28;
  HighsImplications *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  HighsConflictPool *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  HighsCutPool *in_stack_ffffffffffffff50;
  HighsLp *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff78;
  HighsInt ncols;
  HighsCliqueTable *in_stack_ffffffffffffff80;
  HighsMipSolver *pHVar1;
  HighsObjectiveFunction *this_03;
  
  ncols = (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  in_RDI->callback_ = (HighsCallback *)in_RSI;
  pHVar1 = in_RDI;
  HighsMipSolver::numCol(in_RSI);
  HighsCutPool::HighsCutPool
            (in_stack_ffffffffffffff50,(HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (HighsInt)in_stack_ffffffffffffff48,
             (HighsInt)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  HighsConflictPool::HighsConflictPool
            (in_stack_ffffffffffffff40,(HighsInt)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (HighsInt)in_stack_ffffffffffffff38);
  this_03 = (HighsObjectiveFunction *)
            &in_RDI[1].timer_.clock_start.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  HighsDomain::HighsDomain(unaff_retaddr,pHVar1);
  pHVar1 = (HighsMipSolver *)&in_RDI[3].analysis_.model_name._M_string_length;
  HighsLpRelaxation::HighsLpRelaxation(in_stack_00000030,in_stack_00000028);
  memset(&in_RDI[0x2e].analysis_.node_search_time.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage,0,0x168);
  HighsPseudocost::HighsPseudocost(in_stack_fffffffffffffee0);
  HighsMipSolver::numCol(in_RSI);
  HighsCliqueTable::HighsCliqueTable(in_stack_ffffffffffffff80,ncols);
  HighsImplications::HighsImplications(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  HighsPrimalHeuristics::HighsPrimalHeuristics
            ((HighsPrimalHeuristics *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  HighsRedcostFixing::HighsRedcostFixing((HighsRedcostFixing *)in_stack_fffffffffffffee0);
  HighsObjectiveFunction::HighsObjectiveFunction(this_03,pHVar1);
  presolve::HighsPostsolveStack::HighsPostsolveStack
            ((HighsPostsolveStack *)in_stack_fffffffffffffee0);
  *(undefined4 *)
   &in_RDI[0x31].timer_.clock_num_call.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = 8;
  HighsLp::HighsLp(in_stack_ffffffffffffff60);
  *(undefined1 *)
   &in_RDI[0x33].analysis_.dive_time.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x33].analysis_.dive_time.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x33].analysis_.dive_time.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined4 *)
   ((long)&in_RDI[0x33].analysis_.dive_time.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined1 *)
   &in_RDI[0x33].analysis_.dive_time.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[0x33].analysis_.dive_time.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)
   &in_RDI[0x33].analysis_.node_search_time.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&in_RDI[0x33].analysis_.node_search_time.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[0x33].analysis_.node_search_time.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x618514);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x61852d);
  this_02 = (HighsSymmetries *)
            &in_RDI[0x33].timer_.clock_num_call.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x618546);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x61855f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x618578);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x618591);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6185aa);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6185c3);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6185dc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6185f8);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x618614);
  HighsSymmetries::HighsSymmetries(this_02);
  cutpool = (HighsCutPool *)&in_RDI[0x34].analysis_.node_search_time;
  std::shared_ptr<const_StabilizerOrbits>::shared_ptr
            ((shared_ptr<const_StabilizerOrbits> *)0x61864b);
  in_RDI[0x34].analysis_.node_search_time.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[0x34].timer_._vptr_HighsTimer = (_func_int **)0x0;
  in_RDI[0x34].timer_.initial_clock_start = 0.0;
  *(undefined8 *)&in_RDI[0x34].timer_.num_clock = 0;
  this_00 = (HighsDomain *)&in_RDI[0x34].timer_.clock_num_call;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x618690);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6186a9);
  this_01 = (HighsNodeQueue *)&in_RDI[0x34].timer_.clock_time;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6186c2);
  in_RDI[0x34].timer_.clock_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
  HighsBasis::HighsBasis((HighsBasis *)this_01);
  in_RDI[0x35].solution_objective_ = -INFINITY;
  *(undefined4 *)&in_RDI[0x35].bound_violation_ = 0;
  *(undefined4 *)((long)&in_RDI[0x35].bound_violation_ + 4) = 0;
  HighsCDouble::HighsCDouble((HighsCDouble *)&in_RDI[0x35].integrality_violation_,0.0);
  in_RDI[0x35].dual_bound_ = 0.0;
  in_RDI[0x35].primal_bound_ = 0.0;
  in_RDI[0x35].gap_ = 0.0;
  in_RDI[0x35].node_count_ = 0;
  in_RDI[0x35].total_lp_iterations_ = 0;
  in_RDI[0x35].primal_dual_integral_ = 0.0;
  in_RDI[0x35].improving_solution_file_ = (FILE *)0x0;
  in_RDI[0x35].saved_objective_and_solution_.
  super__Vector_base<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[0x35].saved_objective_and_solution_.
  super__Vector_base<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[0x35].saved_objective_and_solution_.
  super__Vector_base<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[0x35].submip = false;
  *(undefined3 *)&in_RDI[0x35].field_0xb1 = 0;
  in_RDI[0x35].submip_level = 0;
  *(undefined8 *)&in_RDI[0x35].max_submip_level = 0;
  in_RDI[0x35].rootbasis = (HighsBasis *)0x0;
  in_RDI[0x35].pscostinit = (HighsPseudocostInitialization *)0x0;
  in_RDI[0x35].clqtableinit = (HighsCliqueTable *)0x0;
  in_RDI[0x35].implicinit = (HighsImplications *)0x0;
  in_RDI[0x35].mipdata_._M_t.
  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
  super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl = (HighsMipSolverData *)0x0;
  in_RDI[0x35].analysis_.timer_ = (HighsTimer *)0x0;
  *(undefined8 *)&in_RDI[0x35].analysis_.model_name = 0;
  in_RDI[0x35].analysis_.model_name._M_string_length = 0;
  *(undefined4 *)&in_RDI[0x35].analysis_.model_name.field_2 = 0;
  *(undefined8 *)((long)&in_RDI[0x35].analysis_.model_name.field_2 + 8) = 0xfff0000000000000;
  in_RDI[0x35].analysis_.mip_clocks.timer_pointer_ = (HighsTimer *)0x7ff0000000000000;
  in_RDI[0x35].analysis_.mip_clocks.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x7ff0000000000000;
  in_RDI[0x35].analysis_.mip_clocks.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x7ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x61885a);
  HighsNodeQueue::HighsNodeQueue(this_01);
  HighsDebugSol::HighsDebugSol((HighsDebugSol *)&in_RDI[0x36].model_,in_RSI);
  HighsDomain::addCutpool(this_00,cutpool);
  HighsDomain::addConflictPool(this_00,(HighsConflictPool *)cutpool);
  return;
}

Assistant:

HighsMipSolverData(HighsMipSolver& mipsolver)
      : mipsolver(mipsolver),
        cutpool(mipsolver.numCol(), mipsolver.options_mip_->mip_pool_age_limit,
                mipsolver.options_mip_->mip_pool_soft_limit),
        conflictPool(5 * mipsolver.options_mip_->mip_pool_age_limit,
                     mipsolver.options_mip_->mip_pool_soft_limit),
        domain(mipsolver),
        lp(mipsolver),
        pseudocost(),
        cliquetable(mipsolver.numCol()),
        implications(mipsolver),
        heuristics(mipsolver),
        objectiveFunction(mipsolver),
        presolve_status(HighsPresolveStatus::kNotSet),
        cliquesExtracted(false),
        rowMatrixSet(false),
        analyticCenterComputed(false),
        analyticCenterStatus(HighsModelStatus::kNotset),
        detectSymmetries(false),
        numRestarts(0),
        numRestartsRoot(0),
        numCliqueEntriesAfterPresolve(0),
        numCliqueEntriesAfterFirstPresolve(0),
        feastol(0.0),
        epsilon(0.0),
        heuristic_effort(0.0),
        dispfreq(0),
        firstlpsolobj(-kHighsInf),
        rootlpsolobj(-kHighsInf),
        numintegercols(0),
        maxTreeSizeLog2(0),
        pruned_treeweight(0),
        avgrootlpiters(0.0),
        disptime(0.0),
        last_disptime(0.0),
        firstrootlpiters(0),
        num_nodes(0),
        num_leaves(0),
        num_leaves_before_run(0),
        num_nodes_before_run(0),
        total_repair_lp(0),
        total_repair_lp_feasible(0),
        total_repair_lp_iterations(0),
        total_lp_iterations(0),
        heuristic_lp_iterations(0),
        sepa_lp_iterations(0),
        sb_lp_iterations(0),
        total_lp_iterations_before_run(0),
        heuristic_lp_iterations_before_run(0),
        sepa_lp_iterations_before_run(0),
        sb_lp_iterations_before_run(0),
        num_disp_lines(0),
        numImprovingSols(0),
        lower_bound(-kHighsInf),
        upper_bound(kHighsInf),
        upper_limit(kHighsInf),
        optimality_limit(kHighsInf),
        debugSolution(mipsolver) {
    domain.addCutpool(cutpool);
    domain.addConflictPool(conflictPool);
  }